

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_key.cpp
# Opt level: O2

Privkey * __thiscall
cfd::api::KeyApi::GetPrivkeyFromWif
          (Privkey *__return_storage_ptr__,KeyApi *this,string *wif,NetType *net_type,
          bool *is_compressed)

{
  bool bVar1;
  CfdException *this_00;
  bool is_compress;
  allocator local_4d;
  NetType temp_net_type;
  string local_48;
  
  core::Privkey::Privkey(__return_storage_ptr__);
  is_compress = true;
  temp_net_type = kMainnet;
  bVar1 = core::Privkey::HasWif(wif,&temp_net_type,&is_compress);
  if (bVar1) {
    core::Privkey::FromWif((Privkey *)&local_48,wif,temp_net_type,is_compress);
    core::Privkey::operator=(__return_storage_ptr__,(Privkey *)&local_48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
    if (net_type != (NetType *)0x0) {
      *net_type = temp_net_type;
    }
    if (is_compressed != (bool *)0x0) {
      *is_compressed = is_compress;
    }
  }
  bVar1 = core::Privkey::IsValid(__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_48,"Failed to GetPrivkeyFromWif. Wif format error.",&local_4d);
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_48);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

Privkey KeyApi::GetPrivkeyFromWif(
    const std::string& wif, NetType* net_type, bool* is_compressed) const {
  Privkey key;
  bool is_compress = true;
  NetType temp_net_type = NetType::kMainnet;

  bool has_wif = Privkey::HasWif(wif, &temp_net_type, &is_compress);
  if (has_wif) {
    key = Privkey::FromWif(wif, temp_net_type, is_compress);
    if (net_type != nullptr) *net_type = temp_net_type;
    if (is_compressed != nullptr) *is_compressed = is_compress;
  }

  if (!key.IsValid()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to GetPrivkeyFromWif. Wif format error.");
  }
  return key;
}